

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O0

uint64_t pac_cell_shuffle(uint64_t i)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t o;
  uint64_t i_local;
  
  uVar1 = extract64(i,0x34,4);
  uVar2 = extract64(i,0x18,4);
  uVar3 = extract64(i,0x2c,4);
  uVar4 = extract64(i,0,4);
  uVar5 = extract64(i,0x1c,4);
  uVar6 = extract64(i,0x30,4);
  uVar7 = extract64(i,4,4);
  uVar8 = extract64(i,0x28,4);
  uVar9 = extract64(i,0x20,4);
  uVar10 = extract64(i,0xc,4);
  uVar11 = extract64(i,0x38,4);
  uVar12 = extract64(i,0x14,4);
  uVar13 = extract64(i,8,4);
  uVar14 = extract64(i,0x24,4);
  uVar15 = extract64(i,0x10,4);
  uVar16 = extract64(i,0x3c,4);
  return uVar16 << 0x3c |
         uVar15 << 0x38 |
         uVar14 << 0x34 |
         uVar13 << 0x30 |
         uVar12 << 0x2c |
         uVar11 << 0x28 |
         uVar10 << 0x24 |
         uVar9 << 0x20 |
         uVar8 << 0x1c |
         uVar7 << 0x18 |
         uVar6 << 0x14 | uVar5 << 0x10 | uVar4 << 0xc | uVar3 << 8 | uVar2 << 4 | uVar1;
}

Assistant:

static uint64_t pac_cell_shuffle(uint64_t i)
{
    uint64_t o = 0;

    o |= extract64(i, 52, 4);
    o |= extract64(i, 24, 4) << 4;
    o |= extract64(i, 44, 4) << 8;
    o |= extract64(i,  0, 4) << 12;

    o |= extract64(i, 28, 4) << 16;
    o |= extract64(i, 48, 4) << 20;
    o |= extract64(i,  4, 4) << 24;
    o |= extract64(i, 40, 4) << 28;

    o |= extract64(i, 32, 4) << 32;
    o |= extract64(i, 12, 4) << 36;
    o |= extract64(i, 56, 4) << 40;
    o |= extract64(i, 20, 4) << 44;

    o |= extract64(i,  8, 4) << 48;
    o |= extract64(i, 36, 4) << 52;
    o |= extract64(i, 16, 4) << 56;
    o |= extract64(i, 60, 4) << 60;

    return o;
}